

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.h
# Opt level: O0

void __thiscall cmFindCommon::PathLabel::PathLabel(PathLabel *this,string *label)

{
  string local_38;
  string *local_18;
  string *label_local;
  PathLabel *this_local;
  
  local_18 = label;
  label_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)label);
  cmPathLabel::cmPathLabel(&this->super_cmPathLabel,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

PathLabel(const std::string& label)
      : cmPathLabel(label)
    {
    }